

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

CURLcode file_do(connectdata *conn,_Bool *done)

{
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 *puVar1;
  long lVar2;
  CURLcode CVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  int iVar7;
  CURLcode CVar8;
  int iVar9;
  char *pcVar10;
  __off64_t _Var11;
  size_t sVar12;
  size_t len;
  size_t sVar13;
  curl_off_t cVar14;
  size_t sVar15;
  undefined8 uVar16;
  char *pcVar17;
  char *pcVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  curltime cVar24;
  long local_178;
  tm buffer;
  char header [80];
  stat statbuf;
  
  data = conn->data;
  pcVar17 = (data->state).buffer;
  *done = true;
  Curl_pgrsStartNow(data);
  data_00 = conn->data;
  puVar1 = (undefined8 *)(data_00->req).protop;
  if ((data->set).upload != true) {
    iVar5 = *(int *)(puVar1 + 2);
    iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
    lVar19 = statbuf.st_size;
    if (iVar7 == -1) {
      lVar19 = 0;
      CVar6 = ~CURLE_OK;
    }
    else {
      (data->info).filetime = statbuf.st_mtim.tv_sec;
      if ((((data->state).range == (char *)0x0) && ((data->set).timecondition != CURL_TIMECOND_NONE)
          ) && (_Var4 = Curl_meets_timecondition(data,(data->info).filetime), !_Var4)) {
        *done = true;
        return CURLE_OK;
      }
      bVar20 = 0;
      curl_msnprintf(header,0x50,"Content-Length: %ld\r\n");
      CVar6 = Curl_client_write(conn,2,header,0);
      if (CVar6 == CURLE_OK) {
        bVar20 = 0;
        CVar6 = Curl_client_write(conn,2,"Accept-ranges: bytes\r\n",0);
        if (CVar6 == CURLE_OK) {
          CVar6 = Curl_gmtime(statbuf.st_mtim.tv_sec,&buffer);
          if (CVar6 == CURLE_OK) {
            iVar9 = 6;
            if (buffer.tm_wday != 0) {
              iVar9 = buffer.tm_wday + -1;
            }
            pcVar18 = "\r\n";
            if ((data->set).opt_no_body != false) {
              pcVar18 = "";
            }
            curl_msnprintf(header,0x50,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
                           Curl_wkday[iVar9],(ulong)(uint)buffer.tm_mday,Curl_month[buffer.tm_mon],
                           (ulong)(buffer.tm_year + 0x76c),(ulong)(uint)buffer.tm_hour,
                           (ulong)(uint)buffer.tm_min,(ulong)(uint)buffer.tm_sec,pcVar18);
            CVar6 = Curl_client_write(conn,2,header,0);
            if (CVar6 == CURLE_OK) {
              Curl_pgrsSetDownloadSize(data,lVar19);
              bVar20 = (data->set).opt_no_body ^ 1;
              CVar6 = CURLE_OK;
            }
            else {
              bVar20 = 0;
            }
          }
          else {
            bVar20 = 0;
          }
        }
      }
      if (bVar20 == 0) {
        return CVar6;
      }
    }
    CVar8 = Curl_range(conn);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    lVar21 = (data->state).resume_from;
    if (lVar21 < 0) {
      if (iVar7 == -1) {
        Curl_failf(data,"Can\'t get the size of file.");
        return CURLE_READ_ERROR;
      }
      (data->state).resume_from = lVar21 + statbuf.st_size;
    }
    lVar21 = (data->state).resume_from;
    if (lVar19 < lVar21) {
      Curl_failf(data,"failed to resume file:// transfer");
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    bVar22 = iVar7 == -1;
    lVar2 = (data->req).maxdownload;
    lVar19 = lVar19 - lVar21;
    if (0 < lVar2) {
      lVar19 = lVar2;
    }
    bVar23 = lVar19 == 0;
    if (iVar7 != -1) {
      Curl_pgrsSetDownloadSize(data,lVar19);
    }
    lVar21 = (data->state).resume_from;
    if ((lVar21 != 0) && (_Var11 = lseek64(iVar5,lVar21,0), lVar21 != _Var11)) {
      return CURLE_BAD_DOWNLOAD_RESUME;
    }
    Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    lVar21 = 0;
    CVar8 = CURLE_OK;
    do {
      if (CVar8 != CURLE_OK) goto LAB_0010ab7c;
      if (bVar22 || bVar23) {
        sVar12 = (data->set).buffer_size - 1;
      }
      else {
        sVar12 = (data->set).buffer_size;
        if (lVar19 < (long)sVar12) {
          sVar12 = curlx_sotouz(lVar19);
        }
      }
      len = read(iVar5,pcVar17,sVar12);
      if (0 < (long)len) {
        pcVar17[len] = '\0';
      }
      iVar7 = 3;
      CVar3 = CVar6;
      if ((0 < (long)len) && (lVar19 != 0 || (bVar22 || bVar23))) {
        lVar21 = lVar21 + len;
        sVar15 = len;
        if (bVar22 || bVar23) {
          sVar15 = 0;
        }
        lVar19 = lVar19 - sVar15;
        iVar7 = 1;
        CVar8 = Curl_client_write(conn,1,pcVar17,len);
        CVar3 = CVar8;
        if (CVar8 == CURLE_OK) {
          Curl_pgrsSetDownloadCounter(data,lVar21);
          iVar9 = Curl_pgrsUpdate(conn);
          CVar8 = CURLE_ABORTED_BY_CALLBACK;
          iVar7 = 0;
          CVar3 = CVar6;
          if (iVar9 == 0) {
            cVar24 = Curl_now();
            CVar8 = Curl_speedcheck(data,cVar24);
          }
        }
      }
      CVar6 = CVar3;
    } while (iVar7 == 0);
    if (iVar7 != 3) {
      return CVar6;
    }
LAB_0010ab7c:
    iVar5 = Curl_pgrsUpdate(conn);
    if (iVar5 != 0) {
      return CURLE_ABORTED_BY_CALLBACK;
    }
    return CVar8;
  }
  pcVar17 = (char *)*puVar1;
  pcVar10 = strchr(pcVar17,0x2f);
  pcVar18 = (data_00->state).buffer;
  (data_00->req).upload_fromhere = pcVar18;
  if (pcVar10 == (char *)0x0) {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  if (pcVar10[1] == '\0') {
    return CURLE_FILE_COULDNT_READ_FILE;
  }
  iVar5 = open64(pcVar17,(uint)((data_00->state).resume_from != 0) * 0x200 + 0x241,
                 (data_00->set).new_file_perms);
  if (iVar5 < 0) {
    uVar16 = *puVar1;
    pcVar17 = "Can\'t open %s for writing";
LAB_0010a8b2:
    Curl_failf(data_00,pcVar17,uVar16);
    CVar6 = CURLE_WRITE_ERROR;
  }
  else {
    lVar19 = (data_00->state).infilesize;
    if (lVar19 != -1) {
      Curl_pgrsSetUploadSize(data_00,lVar19);
    }
    if ((data_00->state).resume_from < 0) {
      iVar7 = fstat64(iVar5,(stat64 *)&statbuf);
      if (iVar7 != 0) {
        close(iVar5);
        uVar16 = *puVar1;
        pcVar17 = "Can\'t get the size of %s";
        goto LAB_0010a8b2;
      }
      (data_00->state).resume_from = statbuf.st_size;
    }
    local_178 = 0;
    CVar6 = CURLE_OK;
    do {
      if (CVar6 != CURLE_OK) break;
      CVar6 = Curl_fillreadbuffer(conn,(data_00->set).buffer_size,(size_t *)header);
      if (CVar6 == CURLE_OK) {
        CVar6 = CURLE_OK;
        if (header._0_8_ != 0) {
          lVar19 = (data_00->state).resume_from;
          pcVar17 = pcVar18;
          sVar12 = header._0_8_;
          if (lVar19 != 0) {
            sVar13 = header._0_8_ - lVar19;
            lVar21 = 0;
            if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
              lVar21 = lVar19;
            }
            sVar12 = 0;
            if (sVar13 != 0 && lVar19 <= (long)header._0_8_) {
              sVar12 = sVar13;
            }
            cVar14 = -sVar13;
            if (lVar19 < (long)header._0_8_) {
              cVar14 = 0;
            }
            (data_00->state).resume_from = cVar14;
            pcVar17 = pcVar18 + lVar21;
          }
          sVar13 = write(iVar5,pcVar17,sVar12);
          if (sVar13 == sVar12) {
            local_178 = local_178 + sVar12;
            Curl_pgrsSetUploadCounter(data_00,local_178);
            iVar7 = Curl_pgrsUpdate(conn);
            CVar6 = CURLE_ABORTED_BY_CALLBACK;
            bVar22 = true;
            if (iVar7 == 0) {
              cVar24 = Curl_now();
              CVar6 = Curl_speedcheck(data_00,cVar24);
            }
            goto LAB_0010a743;
          }
          CVar6 = CURLE_SEND_ERROR;
        }
        bVar22 = false;
      }
      else {
        bVar22 = false;
      }
LAB_0010a743:
    } while (bVar22);
    if (CVar6 == CURLE_OK) {
      iVar7 = Curl_pgrsUpdate(conn);
      CVar6 = CURLE_ABORTED_BY_CALLBACK;
      if (iVar7 == 0) {
        CVar6 = CURLE_OK;
      }
    }
    close(iVar5);
  }
  return CVar6;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size = 0;
  bool size_known;
  bool fstated = FALSE;
  struct Curl_easy *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  if(fstated) {
    time_t filetime;
    struct tm buffer;
    const struct tm *tm = &buffer;
    char header[80];
    msnprintf(header, sizeof(header),
              "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n",
              expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    filetime = (time_t)statbuf.st_mtime;
    result = Curl_gmtime(filetime, &buffer);
    if(result)
      return result;

    /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
    msnprintf(header, sizeof(header),
              "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n%s",
              Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
              tm->tm_mday,
              Curl_month[tm->tm_mon],
              tm->tm_year + 1900,
              tm->tm_hour,
              tm->tm_min,
              tm->tm_sec,
              data->set.opt_no_body ? "": "\r\n");
    result = Curl_client_write(conn, CLIENTWRITE_HEADER, header, 0);
    if(result)
      return result;
    /* set the file size to make it available post transfer */
    Curl_pgrsSetDownloadSize(data, expected_size);
    if(data->set.opt_no_body)
      return result;
  }

  /* Check whether file range has been specified */
  result = Curl_range(conn);
  if(result)
    return result;

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream if the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(!fstated || (expected_size == 0))
    size_known = FALSE;
  else
    size_known = TRUE;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    ssize_t nread;
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread;

    if(size_known) {
      bytestoread = (expected_size < data->set.buffer_size) ?
        curlx_sotouz(expected_size) : (size_t)data->set.buffer_size;
    }
    else
      bytestoread = data->set.buffer_size-1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || (size_known && (expected_size == 0)))
      break;

    bytecount += nread;
    if(size_known)
      expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, Curl_now());
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}